

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

StringRef __thiscall Catch::trim(Catch *this,StringRef ref)

{
  char *pcVar1;
  Catch *pCVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  StringRef SVar10;
  
  pcVar6 = ref.m_start;
  pcVar1 = (char *)0x0;
  while (((pcVar4 = pcVar6, pcVar6 != pcVar1 &&
          (pcVar4 = pcVar1, (ulong)(byte)this[(long)pcVar1] < 0x21)) &&
         ((0x100002600U >> ((ulong)(byte)this[(long)pcVar1] & 0x3f) & 1) != 0))) {
    pcVar1 = pcVar1 + 1;
  }
  pcVar7 = pcVar6;
  pcVar9 = pcVar6;
  if (pcVar4 < pcVar6) {
    pcVar9 = pcVar4;
  }
  while (((pcVar8 = pcVar9, pcVar4 < pcVar7 &&
          (pcVar8 = pcVar7, (ulong)(byte)(this + -1)[(long)pcVar7] < 0x21)) &&
         ((0x100002600U >> ((ulong)(byte)(this + -1)[(long)pcVar7] & 0x3f) & 1) != 0))) {
    pcVar7 = pcVar7 + -1;
  }
  uVar3 = (long)pcVar6 - (long)pcVar4;
  if ((ulong)((long)pcVar8 - (long)pcVar4) <= (ulong)((long)pcVar6 - (long)pcVar4)) {
    uVar3 = (long)pcVar8 - (long)pcVar4;
  }
  uVar5 = 0;
  if (pcVar1 < pcVar6) {
    uVar5 = uVar3;
  }
  pCVar2 = (Catch *)0x16f01c;
  if (pcVar1 < pcVar6) {
    pCVar2 = this + (long)pcVar4;
  }
  SVar10.m_size = uVar5;
  SVar10.m_start = (char *)pCVar2;
  return SVar10;
}

Assistant:

StringRef trim(StringRef ref) {
        const auto is_ws = [](char c) {
            return c == ' ' || c == '\t' || c == '\n' || c == '\r';
        };
        size_t real_begin = 0;
        while (real_begin < ref.size() && is_ws(ref[real_begin])) { ++real_begin; }
        size_t real_end = ref.size();
        while (real_end > real_begin && is_ws(ref[real_end - 1])) { --real_end; }

        return ref.substr(real_begin, real_end - real_begin);
    }